

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ComputeInvocationsTestInstance *this)

{
  VkDeviceSize VVar1;
  TestStatus *pTVar2;
  deUint32 dVar3;
  DeviceInterface *vk;
  VkDevice device;
  long lVar4;
  VkPhysicalDeviceProperties *pVVar5;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  uint uVar6;
  ParametersCompute *parm;
  pointer this_03;
  ulong _size;
  bool bVar7;
  SharedPtr<vkt::Draw::Buffer> local_1b8;
  SharedPtr<vkt::Draw::Buffer> buffer;
  undefined1 local_198 [16];
  pointer local_188;
  VkDescriptorPool VStack_180;
  VkBufferUsageFlags local_178;
  pointer local_170;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  TestStatus *local_140;
  VkDescriptorSetAllocateInfo allocateParams;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_108;
  VkDescriptorBufferInfo descriptorInfo;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_c8;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_a8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_88;
  undefined1 local_68 [32];
  CmdPoolCreateInfo cmdPoolCreateInfo;
  
  parm = (ParametersCompute *)this;
  local_140 = __return_storage_ptr__;
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[3])(this);
  vk = Context::getDeviceInterface
                 ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_StatisticQueryTestInstance).super_TestInstance.m_context)
  ;
  this_03 = (this->m_parameters->
            super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = ((long)(this->m_parameters->
                 super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)this_03) / 0x38;
  uVar6 = 0;
  while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
    dVar3 = getComputeExecution((ComputeInvocationsTestInstance *)this_03,parm);
    if (uVar6 <= dVar3) {
      uVar6 = dVar3;
    }
    this_03 = this_03 + 1;
  }
  pVVar5 = Context::getDeviceProperties
                     ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  VVar1 = (pVVar5->limits).nonCoherentAtomSize;
  _size = -VVar1 & (ulong)uVar6 * 4 + -1 + VVar1;
  Draw::BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)local_198,_size,0x20,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0)
  ;
  allocator = Context::getDefaultAllocator
                        ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&buffer,vk,device,(VkBufferCreateInfo *)local_198,allocator,
             (MemoryRequirement)0x1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_160);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_198);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)local_198,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&allocateParams,this_00,vk,device,0);
  local_68._16_8_ = allocateParams.descriptorPool.m_internal;
  local_68._24_8_ = allocateParams._24_8_;
  local_68._0_8_ = allocateParams._0_8_;
  local_68._8_8_ = allocateParams.pNext;
  allocateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateParams._4_4_ = 0;
  allocateParams.pNext = (void *)0x0;
  allocateParams.descriptorPool.m_internal = 0;
  allocateParams.descriptorSetCount = 0;
  allocateParams._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&allocateParams);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_198);
  local_198._0_4_ = 0x1e;
  local_198._8_8_ = (pointer)0x0;
  local_188 = (pointer)&DAT_100000000;
  local_178 = 0;
  local_170 = (pointer)0x0;
  VStack_180.m_internal = (deUint64)local_68;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&allocateParams,vk,device,
             (VkPipelineLayoutCreateInfo *)local_198,(VkAllocationCallbacks *)0x0);
  local_a8.m_data.object.m_internal = allocateParams._0_8_;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)allocateParams.pNext;
  local_a8.m_data.deleter.m_device = (VkDevice)allocateParams.descriptorPool.m_internal;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)allocateParams._24_8_;
  allocateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateParams._4_4_ = 0;
  allocateParams.pNext = (void *)0x0;
  allocateParams.descriptorPool.m_internal = 0;
  allocateParams.descriptorSetCount = 0;
  allocateParams._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&allocateParams);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&allocateParams);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&allocateParams,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1)
  ;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_198,this_01,vk,device,1,1);
  local_c8.m_data.deleter.m_device = (VkDevice)local_188;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)VStack_180.m_internal;
  local_c8.m_data.object.m_internal = local_198._0_8_;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_198._8_8_;
  local_198._0_8_ = 0;
  local_198._8_8_ = (pointer)0x0;
  local_188 = (pointer)0x0;
  VStack_180.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_198);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&allocateParams);
  allocateParams.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocateParams.pNext = (void *)0x0;
  allocateParams.descriptorPool.m_internal = local_c8.m_data.object.m_internal;
  allocateParams.descriptorSetCount = 1;
  allocateParams.pSetLayouts = (VkDescriptorSetLayout *)local_68;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)local_198,vk,device,&allocateParams);
  local_108.m_data.deleter.m_device = (VkDevice)local_188;
  local_108.m_data.deleter.m_pool.m_internal = VStack_180.m_internal;
  local_108.m_data.object.m_internal = local_198._0_8_;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)local_198._8_8_;
  local_198._0_8_ = 0;
  local_198._8_8_ = (pointer)0x0;
  local_188 = (pointer)0x0;
  VStack_180.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_198);
  descriptorInfo.buffer.m_internal =
       ((buffer.m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  descriptorInfo.offset = 0;
  descriptorInfo.range = _size;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_198);
  local_88.m_data.object.m_internal._0_4_ = 0;
  local_88.m_data.object.m_internal._4_4_ = 0;
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)local_198,
                       (VkDescriptorSet)local_108.m_data.object.m_internal,(Location *)&local_88,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&descriptorInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_198);
  dVar3 = Context::getUniversalQueueFamilyIndex
                    ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo(&cmdPoolCreateInfo,dVar3,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_88,vk,device,
             &cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  local_188 = (pointer)local_88.m_data.deleter.m_device;
  VStack_180.m_internal = (deUint64)local_88.m_data.deleter.m_allocator;
  local_198._0_8_ = local_88.m_data.object.m_internal;
  local_198._8_8_ = local_88.m_data.deleter.m_deviceIface;
  local_88.m_data.object.m_internal._0_4_ = 0;
  local_88.m_data.object.m_internal._4_4_ = 0;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_88.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_88);
  pTVar2 = local_140;
  local_1b8.m_ptr = buffer.m_ptr;
  local_1b8.m_state = buffer.m_state;
  if (buffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (buffer.m_state)->strongRefCount = (buffer.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (buffer.m_state)->weakRefCount = (buffer.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[4])
            (local_140,this,local_198,local_a8.m_data.object.m_internal,&local_108,&local_1b8,_size)
  ;
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&local_1b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_198);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_108);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_68);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&buffer);
  return pTVar2;
}

Assistant:

tcu::TestStatus	ComputeInvocationsTestInstance::iterate (void)
{
	checkExtensions();
	const DeviceInterface&				vk						= m_context.getDeviceInterface();
	const VkDevice						device					= m_context.getDevice();
	deUint32							maxSize					= 0u;

	for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
		maxSize = deMaxu32(maxSize, getComputeExecution(m_parameters[parametersNdx]));

	const VkDeviceSize					bufferSizeBytes			= static_cast<VkDeviceSize>(deAlignSize(static_cast<size_t>(sizeof(deUint32) * maxSize),
																								static_cast<size_t>(m_context.getDeviceProperties().limits.nonCoherentAtomSize)));
	de::SharedPtr<Buffer>				buffer					= Buffer::createAndAlloc(vk, device, BufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
																							 m_context.getDefaultAllocator(), MemoryRequirement::HostVisible);

	const Unique<VkDescriptorSetLayout>	descriptorSetLayout		(DescriptorSetLayoutBuilder()
			.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
			.build(vk, device));

	const Unique<VkPipelineLayout>		pipelineLayout			(makePipelineLayout(vk, device, &(*descriptorSetLayout)));

	const Unique<VkDescriptorPool>		descriptorPool			(DescriptorPoolBuilder()
			.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
			.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const VkDescriptorSetAllocateInfo allocateParams		=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,	// VkStructureType				sType;
		DE_NULL,										// const void*					pNext;
		*descriptorPool,								// VkDescriptorPool				descriptorPool;
		1u,												// deUint32						setLayoutCount;
		&(*descriptorSetLayout),						// const VkDescriptorSetLayout*	pSetLayouts;
	};

	const Unique<VkDescriptorSet>		descriptorSet		(allocateDescriptorSet(vk, device, &allocateParams));
	const VkDescriptorBufferInfo		descriptorInfo		=
	{
		buffer->object(),	//VkBuffer		buffer;
		0ull,				//VkDeviceSize	offset;
		bufferSizeBytes,	//VkDeviceSize	range;
	};

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfo)
		.update(vk, device);

	const CmdPoolCreateInfo			cmdPoolCreateInfo	(m_context.getUniversalQueueFamilyIndex());
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, &cmdPoolCreateInfo));

	return executeTest (*cmdPool, *pipelineLayout, *descriptorSet, buffer, bufferSizeBytes);
}